

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

void join(string *result,string *separator,vector<int,_std::allocator<int>_> *items)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  stringstream s;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar2 = (ulong)((long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar1 = (int)uVar2;
  if (iVar1 != 0) {
    uVar3 = 0;
    do {
      std::ostream::operator<<
                (local_1a8,
                 (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3]);
      if (uVar3 < iVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(separator->_M_dataplus)._M_p,separator->_M_string_length);
      }
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xffffffff) != uVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)result,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void join (
  std::string& result,
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  unsigned int size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    s << items[i];
    if (i < size - 1)
      s << separator;
  }

  result = s.str ();
}